

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O2

CTX_PTR_conflict CreateSuccessors(CPpmd7 *p,Bool skip)

{
  CPpmd_State *pCVar1;
  Byte BVar2;
  byte bVar3;
  uint uVar4;
  CPpmd_State *pCVar5;
  Byte *pBVar6;
  CTX_PTR_conflict pCVar7;
  Byte *pBVar8;
  Byte *pBVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  CPpmd_State *pCVar13;
  CPpmd_State *pCVar14;
  char cVar15;
  CTX_PTR_conflict pCVar16;
  ulong uVar17;
  CPpmd_State *ps [64];
  
  pCVar5 = p->FoundState;
  uVar4 = *(uint *)&pCVar5->SuccessorLow;
  if (skip == 0) {
    ps[0] = pCVar5;
  }
  uVar12 = (uint)(skip == 0);
  pCVar16 = p->MinContext;
  pBVar8 = p->Base;
  do {
    uVar10 = (ulong)pCVar16->Suffix;
    uVar17 = (ulong)uVar12;
    if (uVar10 == 0) {
LAB_0027f6b2:
      BVar2 = pBVar8[uVar4];
      if (pCVar16->NumStats == 1) {
        cVar15 = *(char *)((long)&pCVar16->SummFreq + 1);
      }
      else {
        pBVar6 = pBVar8 + pCVar16->Stats;
        do {
          pBVar9 = pBVar6;
          pBVar6 = pBVar9 + 6;
        } while (*pBVar9 != BVar2);
        bVar3 = pBVar9[1];
        uVar11 = ((uint)pCVar16->SummFreq - ((uint)pCVar16->NumStats + (uint)bVar3)) + 1;
        uVar12 = (uint)bVar3 * 2 - 2;
        if (uVar11 < uVar12) {
          cVar15 = (char)(((uVar12 + uVar11 * 3) - 1) / (uVar11 * 2));
        }
        else {
          cVar15 = uVar11 < (bVar3 - 1) * 5;
        }
        cVar15 = cVar15 + '\x01';
      }
      do {
        uVar17 = uVar17 - 1;
        if (uVar17 == 0xffffffffffffffff) {
          return pCVar16;
        }
        if (p->HiUnit == p->LoUnit) {
          uVar10 = (ulong)p->FreeList[0];
          if (uVar10 == 0) {
            pCVar7 = (CTX_PTR_conflict)AllocUnitsRare(p,0);
            if (pCVar7 == (CTX_PTR_conflict)0x0) {
              return (CTX_PTR_conflict)0x0;
            }
          }
          else {
            pCVar7 = (CTX_PTR_conflict)(pBVar8 + uVar10);
            p->FreeList[0] = *(CPpmd_Void_Ref *)(pBVar8 + uVar10);
          }
        }
        else {
          pCVar7 = (CTX_PTR_conflict)(p->HiUnit + -0xc);
          p->HiUnit = (Byte *)pCVar7;
        }
        pCVar7->NumStats = 1;
        *(Byte *)&pCVar7->SummFreq = BVar2;
        *(char *)((long)&pCVar7->SummFreq + 1) = cVar15;
        pCVar7->Stats = uVar4 + 1;
        pBVar8 = p->Base;
        pCVar7->Suffix = (int)pCVar16 - (int)pBVar8;
        *(int *)&ps[uVar17 & 0xffffffff]->SuccessorLow = (int)pCVar7 - (int)pBVar8;
        pCVar16 = pCVar7;
      } while( true );
    }
    pCVar16 = (CTX_PTR_conflict)(pBVar8 + uVar10);
    if (*(short *)(pBVar8 + uVar10) == 1) {
      pCVar13 = (CPpmd_State *)&pCVar16->SummFreq;
    }
    else {
      pCVar14 = (CPpmd_State *)(pBVar8 + ((ulong)pCVar16->Stats - 6));
      do {
        pCVar13 = pCVar14 + 1;
        pCVar1 = pCVar14 + 1;
        pCVar14 = pCVar13;
      } while ((Byte)*(CPpmd7_Context_Ref *)&pCVar1->Symbol != pCVar5->Symbol);
    }
    if (*(uint *)&pCVar13->SuccessorLow != uVar4) {
      pCVar16 = (CTX_PTR_conflict)(pBVar8 + *(uint *)&pCVar13->SuccessorLow);
      if (uVar12 == 0) {
        return pCVar16;
      }
      goto LAB_0027f6b2;
    }
    uVar12 = uVar12 + 1;
    ps[uVar17] = pCVar13;
  } while( true );
}

Assistant:

static CTX_PTR CreateSuccessors(CPpmd8 *p, Bool skip, CPpmd_State *s1, CTX_PTR c)
{
  CPpmd_State upState;
  Byte flags;
  CPpmd_Byte_Ref upBranch = (CPpmd_Byte_Ref)SUCCESSOR(p->FoundState);
  /* fixed over Shkarin's code. Maybe it could work without + 1 too. */
  CPpmd_State *ps[PPMD8_MAX_ORDER + 1];
  unsigned numPs = 0;
  
  if (!skip)
    ps[numPs++] = p->FoundState;
  
  while (c->Suffix)
  {
    CPpmd_Void_Ref successor;
    CPpmd_State *s;
    c = SUFFIX(c);
    if (s1)
    {
      s = s1;
      s1 = NULL;
    }
    else if (c->NumStats != 0)
    {
      for (s = STATS(c); s->Symbol != p->FoundState->Symbol; s++);
      if (s->Freq < MAX_FREQ - 9)
      {
        s->Freq++;
        c->SummFreq++;
      }
    }
    else
    {
      s = ONE_STATE(c);
      s->Freq = (Byte)(s->Freq + (!SUFFIX(c)->NumStats & (s->Freq < 24)));
    }
    successor = SUCCESSOR(s);
    if (successor != upBranch)
    {
      c = CTX(successor);
      if (numPs == 0)
        return c;
      break;
    }
    ps[numPs++] = s;
  }
  
  upState.Symbol = *(const Byte *)Ppmd8_GetPtr(p, upBranch);
  SetSuccessor(&upState, upBranch + 1);
  flags = (Byte)(0x10 * (p->FoundState->Symbol >= 0x40) + 0x08 * (upState.Symbol >= 0x40));

  if (c->NumStats == 0)
    upState.Freq = ONE_STATE(c)->Freq;
  else
  {
    UInt32 cf, s0;
    CPpmd_State *s;
    for (s = STATS(c); s->Symbol != upState.Symbol; s++);
    cf = s->Freq - 1;
    s0 = c->SummFreq - c->NumStats - cf;
    upState.Freq = (Byte)(1 + ((2 * cf <= s0) ? (5 * cf > s0) : ((cf + 2 * s0 - 3) / s0)));
  }

  while (numPs != 0)
  {
    /* Create Child */
    CTX_PTR c1; /* = AllocContext(p); */
    if (p->HiUnit != p->LoUnit)
      c1 = (CTX_PTR)(p->HiUnit -= UNIT_SIZE);
    else if (p->FreeList[0] != 0)
      c1 = (CTX_PTR)RemoveNode(p, 0);
    else
    {
      c1 = (CTX_PTR)AllocUnitsRare(p, 0);
      if (!c1)
        return NULL;
    }
    c1->NumStats = 0;
    c1->Flags = flags;
    *ONE_STATE(c1) = upState;
    c1->Suffix = REF(c);
    SetSuccessor(ps[--numPs], REF(c1));
    c = c1;
  }

  return c;
}